

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shufflenetv2.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  int *piVar2;
  char cVar3;
  int iVar4;
  Layer *pLVar5;
  ulong uVar6;
  int i;
  ulong uVar7;
  long lVar8;
  vector<float,_std::allocator<float>_> cls_scores;
  Mat local_1c8;
  Extractor ex;
  ParamDict pd;
  size_t local_160;
  Allocator *local_150;
  uint uStack_144;
  Net shufflenetv2;
  Mat local_d0;
  float norm_vals [3];
  Mat m;
  int local_70;
  int local_6c;
  uchar *local_68;
  
  if (argc == 2) {
    pcVar1 = argv[1];
    std::__cxx11::string::string((string *)&shufflenetv2,pcVar1,(allocator *)&local_d0);
    cv::imread((string *)&m,(int)&shufflenetv2);
    std::__cxx11::string::~string((string *)&shufflenetv2);
    cVar3 = cv::Mat::empty();
    if (cVar3 == '\0') {
      cls_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      cls_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      cls_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ncnn::Net::Net(&shufflenetv2);
      shufflenetv2.opt.use_vulkan_compute = true;
      iVar4 = ncnn::Net::load_param(&shufflenetv2,"shufflenet_v2_x0.5.param");
      if ((iVar4 != 0) ||
         (iVar4 = ncnn::Net::load_model(&shufflenetv2,"shufflenet_v2_x0.5.bin"), iVar4 != 0)) {
        exit(-1);
      }
      ncnn::Mat::from_pixels_resize
                (&local_d0,local_68,2,local_6c,local_70,0xe0,0xe0,(Allocator *)0x0);
      norm_vals[0] = 0.003921569;
      norm_vals[1] = 0.003921569;
      norm_vals[2] = 0.003921569;
      ncnn::Mat::substract_mean_normalize(&local_d0,(float *)0x0,norm_vals);
      ncnn::Net::create_extractor((Net *)&ex);
      ncnn::Extractor::input(&ex,"data",&local_d0);
      local_1c8.cstep = 0;
      local_1c8.data = (void *)0x0;
      local_1c8.refcount._0_4_ = 0;
      local_1c8.refcount._4_4_ = 0;
      local_1c8.elemsize._0_4_ = 0;
      local_1c8.elemsize._4_4_ = 0;
      local_1c8.elempack = 0;
      local_1c8.allocator = (Allocator *)0x0;
      local_1c8.dims = 0;
      local_1c8.w = 0;
      local_1c8.h = 0;
      local_1c8.d = 0;
      local_1c8.c = 0;
      ncnn::Extractor::extract(&ex,"fc",&local_1c8,0);
      pLVar5 = ncnn::create_layer("Softmax");
      ncnn::ParamDict::ParamDict(&pd);
      (*pLVar5->_vptr_Layer[2])(pLVar5,&pd);
      (*pLVar5->_vptr_Layer[9])(pLVar5,&local_1c8,&shufflenetv2.opt);
      (*pLVar5->_vptr_Layer[1])(pLVar5);
      ncnn::ParamDict::~ParamDict(&pd);
      ncnn::Mat::reshape((Mat *)&pd,&local_1c8,local_1c8.h * local_1c8.w * local_1c8.c,
                         (Allocator *)0x0);
      if (pd.d != (ParamDictPrivate *)0x0) {
        LOCK();
        (pd.d)->params[0].type = (pd.d)->params[0].type + 1;
        UNLOCK();
      }
      piVar2 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (local_1c8.allocator == (Allocator *)0x0) {
            free(local_1c8.data);
          }
          else {
            (*(local_1c8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_1c8.data = pd._vptr_ParamDict;
      local_1c8.refcount._0_4_ = SUB84(pd.d,0);
      local_1c8.refcount._4_4_ = (undefined4)((ulong)pd.d >> 0x20);
      local_1c8.elemsize._0_4_ = (int)local_160;
      local_1c8.elemsize._4_4_ = (undefined4)(local_160 >> 0x20);
      local_1c8.allocator = local_150;
      local_1c8.w = uStack_144;
      if (pd.d != (ParamDictPrivate *)0x0) {
        LOCK();
        (pd.d)->params[0].type = (pd.d)->params[0].type + -1;
        UNLOCK();
        if ((pd.d)->params[0].type == 0) {
          if (local_150 == (Allocator *)0x0) {
            free(pd._vptr_ParamDict);
          }
          else {
            (*local_150->_vptr_Allocator[3])();
          }
        }
      }
      std::vector<float,_std::allocator<float>_>::resize(&cls_scores,(long)local_1c8.w);
      uVar6 = 0;
      uVar7 = (ulong)(uint)local_1c8.w;
      if (local_1c8.w < 1) {
        uVar7 = uVar6;
      }
      for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
        cls_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
        ._M_start[uVar6] = *(float *)((long)local_1c8.data + uVar6 * 4);
      }
      piVar2 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (local_1c8.allocator == (Allocator *)0x0) {
            free(local_1c8.data);
          }
          else {
            (*(local_1c8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      ncnn::Extractor::~Extractor(&ex);
      if (local_d0.refcount != (int *)0x0) {
        LOCK();
        *local_d0.refcount = *local_d0.refcount + -1;
        UNLOCK();
        if (*local_d0.refcount == 0) {
          if (local_d0.allocator == (Allocator *)0x0) {
            free(local_d0.data);
          }
          else {
            (*(local_d0.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      ncnn::Net::~Net(&shufflenetv2);
      shufflenetv2.opt.blob_allocator = (Allocator *)0x0;
      shufflenetv2._vptr_Net = (_func_int **)0x0;
      shufflenetv2.opt.lightmode = false;
      shufflenetv2.opt.use_shader_pack8 = false;
      shufflenetv2.opt.use_subgroup_ops = false;
      shufflenetv2.opt.use_reserved_0 = false;
      shufflenetv2.opt.num_threads = 0;
      uVar7 = (ulong)((long)cls_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)cls_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 2;
      iVar4 = (int)uVar7;
      std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::resize
                ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                 &shufflenetv2,(long)iVar4);
      uVar6 = 0;
      uVar7 = uVar7 & 0xffffffff;
      if (iVar4 < 1) {
        uVar7 = uVar6;
      }
      for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
        *(float *)(shufflenetv2._vptr_Net + uVar6) =
             cls_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start[uVar6];
        *(int *)((long)shufflenetv2._vptr_Net + uVar6 * 8 + 4) = (int)uVar6;
      }
      std::
      __partial_sort<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<std::pair<float,int>>>>
                (shufflenetv2._vptr_Net,shufflenetv2._vptr_Net + 3,shufflenetv2.opt._0_8_);
      for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
        fprintf(_stderr,"%d = %f\n",SUB84((double)*(float *)(shufflenetv2._vptr_Net + lVar8),0),
                (ulong)*(uint *)((long)shufflenetv2._vptr_Net + lVar8 * 8 + 4));
      }
      std::_Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::
      ~_Vector_base((_Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
                    &shufflenetv2);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&cls_scores.super__Vector_base<float,_std::allocator<float>_>);
      iVar4 = 0;
    }
    else {
      fprintf(_stderr,"cv::imread %s failed\n",pcVar1);
      iVar4 = -1;
    }
    cv::Mat::~Mat(&m);
  }
  else {
    fprintf(_stderr,"Usage: %s [imagepath]\n",*argv);
    iVar4 = -1;
  }
  return iVar4;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 2)
    {
        fprintf(stderr, "Usage: %s [imagepath]\n", argv[0]);
        return -1;
    }

    const char* imagepath = argv[1];

    cv::Mat m = cv::imread(imagepath, 1);
    if (m.empty())
    {
        fprintf(stderr, "cv::imread %s failed\n", imagepath);
        return -1;
    }

    std::vector<float> cls_scores;
    detect_shufflenetv2(m, cls_scores);

    print_topk(cls_scores, 3);

    return 0;
}